

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* readModifiers_abi_cxx11_
            (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,XMLNode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__s;
  reference pvVar3;
  size_type sVar4;
  size_type sVar5;
  bool local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  size_type local_b8;
  size_type startPos;
  size_type endPos;
  string local_a0;
  undefined1 local_80 [8];
  string value;
  undefined1 local_50 [8];
  string bitCount;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arraySizes;
  XMLNode *node_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&bitCount.field_2 + 8));
  std::__cxx11::string::string((string *)local_50);
  if ((node != (XMLNode *)0x0) &&
     (iVar2 = (*node->_vptr_XMLNode[7])(), CONCAT44(extraout_var,iVar2) != 0)) {
    __s = tinyxml2::XMLNode::Value(node);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,__s,(allocator<char> *)((long)&endPos + 7));
    trim((string *)local_80,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&endPos + 7));
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!value.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                    ,0x147,
                    "std::pair<std::vector<std::string>, std::string> readModifiers(const tinyxml2::XMLNode *)"
                   );
    }
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80,0);
    if (*pvVar3 == '[') {
      startPos = 0;
      while (sVar4 = startPos + 1,
            sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80), sVar4 != sVar5) {
        local_b8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80,'[',startPos);
        bVar1 = local_b8 != 0xffffffffffffffff;
        iVar2 = tinyxml2::XMLNode::GetLineNum(node);
        std::operator+(&local_f8,"could not find \'[\' in <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::operator+(&local_d8,&local_f8,">");
        checkForError(bVar1,iVar2,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        startPos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80,']',local_b8);
        bVar1 = startPos != 0xffffffffffffffff;
        iVar2 = tinyxml2::XMLNode::GetLineNum(node);
        std::operator+(&local_138,"could not find \']\' in <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::operator+(&local_118,&local_138,">");
        checkForError(bVar1,iVar2,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        bVar1 = local_b8 + 2 <= startPos;
        iVar2 = tinyxml2::XMLNode::GetLineNum(node);
        std::operator+(&local_178,"missing content between \'[\' and \']\' in <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::operator+(&local_158,&local_178,">");
        checkForError(bVar1,iVar2,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   local_b8 + 1,~local_b8 + startPos);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&bitCount.field_2 + 8),&local_198);
        std::__cxx11::string::~string((string *)&local_198);
      }
    }
    else {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_80,0);
      if (*pvVar3 == ':') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,1,
                   0xffffffffffffffff);
        trim(&local_1b8,&local_1d8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
      }
      else {
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,0);
        local_291 = true;
        if (*pvVar3 != ';') {
          pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80,0);
          local_291 = *pvVar3 == ')';
        }
        iVar2 = tinyxml2::XMLNode::GetLineNum(node);
        std::operator+(&local_218,"unknown modifier <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::operator+(&local_1f8,&local_218,">");
        checkForError(local_291,iVar2,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
      }
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  std::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&bitCount.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&bitCount.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::vector<std::string>, std::string> readModifiers( tinyxml2::XMLNode const * node )
{
  std::vector<std::string> arraySizes;
  std::string              bitCount;
  if ( node && node->ToText() )
  {
    // following the name there might be some array size
    std::string value = trim( node->Value() );
    assert( !value.empty() );
    if ( value[0] == '[' )
    {
      std::string::size_type endPos = 0;
      while ( endPos + 1 != value.length() )
      {
        const std::string::size_type startPos = value.find( '[', endPos );
        checkForError( startPos != std::string::npos, node->GetLineNum(), "could not find '[' in <" + value + ">" );
        endPos = value.find( ']', startPos );
        checkForError( endPos != std::string::npos, node->GetLineNum(), "could not find ']' in <" + value + ">" );
        checkForError( startPos + 2 <= endPos, node->GetLineNum(), "missing content between '[' and ']' in <" + value + ">" );
        arraySizes.push_back( value.substr( startPos + 1, endPos - startPos - 1 ) );
      }
    }
    else if ( value[0] == ':' )
    {
      bitCount = trim( value.substr( 1 ) );
    }
    else
    {
      checkForError( ( value[0] == ';' ) || ( value[0] == ')' ), node->GetLineNum(), "unknown modifier <" + value + ">" );
    }
  }
  return { arraySizes, bitCount };
}